

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O0

bool __thiscall diy::Direction::operator<(Direction *this,Direction *y)

{
  uint uVar1;
  const_reference piVar2;
  size_t i;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> *this_00;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> *local_20;
  
  local_20 = (small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)0x0;
  while( true ) {
    this_00 = local_20;
    uVar1 = DynamicPoint<int,_4UL>::dimension((DynamicPoint<int,_4UL> *)0x19b0c5);
    if ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)(ulong)uVar1 <= this_00) {
      return false;
    }
    piVar2 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                       (this_00,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    in_stack_ffffffffffffffcc = *piVar2;
    piVar2 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                       (this_00,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (in_stack_ffffffffffffffcc < *piVar2) break;
    piVar2 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                       (this_00,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    in_stack_ffffffffffffffc8 = *piVar2;
    piVar2 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                       (this_00,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (*piVar2 < in_stack_ffffffffffffffc8) {
      return false;
    }
    local_20 = (small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)&local_20->field_0x1;
  }
  return true;
}

Assistant:

bool
      operator<(const diy::Direction& y) const
      {
        for (size_t i = 0; i < dimension(); ++i)
        {
            if ((*this)[i] < y[i]) return true;
            if ((*this)[i] > y[i]) return false;
        }
        return false;
      }